

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc_scan_3tree.c
# Opt level: O0

void prefix_sum(void *a,void *a0,void *xs,bsc_size_t size)

{
  undefined4 local_4c;
  int accu;
  int n;
  int i;
  int *nums;
  int *zero;
  int *result;
  bsc_size_t size_local;
  void *xs_local;
  void *a0_local;
  void *a_local;
  
  local_4c = *a0;
  for (accu = 0; accu < (int)((ulong)(long)size >> 2); accu = accu + 1) {
    local_4c = *(int *)((long)xs + (long)accu * 4) + local_4c;
    *(int *)((long)a + (long)accu * 4) = local_4c;
  }
  return;
}

Assistant:

void prefix_sum( void * a, const void * a0, const void * xs, bsc_size_t size )
{
    int * result = a;
    const int * zero = a0;
    const int * nums = xs;
    int i, n = size/sizeof(int);
    int accu = *zero;

    for ( i = 0; i < n ; ++i ) {
        accu += nums[i];
        result[i] = accu;
    }
}